

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int cycle_phi_p(bb_insn_t_conflict bb_insn)

{
  void *pvVar1;
  ulong local_28;
  size_t i;
  ssa_edge_t_conflict se;
  bb_insn_t_conflict bb_insn_local;
  
  if ((int)*(undefined8 *)&bb_insn->insn->field_0x18 == 0xba) {
    for (local_28 = 1; local_28 < *(ulong *)&bb_insn->insn->field_0x18 >> 0x20;
        local_28 = local_28 + 1) {
      pvVar1 = bb_insn->insn->ops[local_28].data;
      if ((pvVar1 != (void *)0x0) &&
         (*(bb_t_conflict *)(*(long *)((long)pvVar1 + 8) + 0x30) == bb_insn->bb)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int cycle_phi_p (bb_insn_t bb_insn) { /* we are not in pure SSA at this stage */
  ssa_edge_t se;
  if (bb_insn->insn->code != MIR_PHI) return FALSE;
  for (size_t i = 1; i < bb_insn->insn->nops; i++)
    if ((se = bb_insn->insn->ops[i].data) != NULL && se->def->bb == bb_insn->bb) return TRUE;
  return FALSE;
}